

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_19::StringBaseTextGenerator::~StringBaseTextGenerator
          (StringBaseTextGenerator *this)

{
  StringBaseTextGenerator *in_RDI;
  
  ~StringBaseTextGenerator(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

void Print(const char* text, size_t size) override {
    output_.append(text, size);
  }